

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O1

int GetExpectedDisableTestCount(void)

{
  return 0xe;
}

Assistant:

int GetExpectedDisableTestCount()
{
    int expected_disable_test_count = 2;
#if IUTEST_HAS_PARAM_TEST
    expected_disable_test_count += 4;
#endif
#if IUTEST_HAS_PARAM_METHOD_TEST
    expected_disable_test_count += 4;
#endif
#if IUTEST_HAS_TYPED_TEST
    expected_disable_test_count += 2;
#endif
#if IUTEST_HAS_TYPED_TEST_P
    expected_disable_test_count += 2;
#endif
    return expected_disable_test_count;
}